

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_unit.cpp
# Opt level: O1

void run(roaring_bitmap_t **rarray)

{
  roaring_bitmap_t *x1;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *x2_00;
  long lVar1;
  
  lVar1 = 100;
  do {
    x1 = roaring_bitmap_copy((roaring_bitmap_t *)*rarray);
    x2 = roaring_bitmap_copy((roaring_bitmap_t *)rarray[1]);
    x2_00 = roaring_bitmap_copy((roaring_bitmap_t *)rarray[2]);
    roaring_bitmap_and_inplace(x1,x2);
    roaring_bitmap_andnot_inplace(x1,x2_00);
    roaring_bitmap_free(x1);
    roaring_bitmap_free(x2);
    roaring_bitmap_free(x2_00);
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return;
}

Assistant:

void run(roaring_bitmap_t **rarray) {
    for (size_t i = 0; i < 100; i++) {
        roaring_bitmap_t *r1 = roaring_bitmap_copy(rarray[0]);
        roaring_bitmap_t *r2 = roaring_bitmap_copy(rarray[1]);
        roaring_bitmap_t *r3 = roaring_bitmap_copy(rarray[2]);
        roaring_bitmap_and_inplace(r1, r2);
        roaring_bitmap_andnot_inplace(r1, r3);
        roaring_bitmap_free(r1);
        roaring_bitmap_free(r2);
        roaring_bitmap_free(r3);
    }
}